

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O1

ze_result_t
driver::zeDeviceImportExternalSemaphoreExt
          (ze_device_handle_t hDevice,ze_external_semaphore_ext_desc_t *desc,
          ze_external_semaphore_ext_handle_t *phSemaphore)

{
  ze_result_t zVar1;
  
  if (DAT_0010e250 != (code *)0x0) {
    zVar1 = (*DAT_0010e250)();
    return zVar1;
  }
  context_t::get()::count = (ze_external_semaphore_ext_handle_t)((long)context_t::get()::count + 1);
  *phSemaphore = context_t::get()::count;
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDeviceImportExternalSemaphoreExt(
        ze_device_handle_t hDevice,                     ///< [in] The device handle.
        const ze_external_semaphore_ext_desc_t* desc,   ///< [in] The pointer to external semaphore descriptor.
        ze_external_semaphore_ext_handle_t* phSemaphore ///< [out] The handle of the external semaphore imported.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnImportExternalSemaphoreExt = context.zeDdiTable.Device.pfnImportExternalSemaphoreExt;
        if( nullptr != pfnImportExternalSemaphoreExt )
        {
            result = pfnImportExternalSemaphoreExt( hDevice, desc, phSemaphore );
        }
        else
        {
            // generic implementation
            *phSemaphore = reinterpret_cast<ze_external_semaphore_ext_handle_t>( context.get() );

        }

        return result;
    }